

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::update(String *theWindowName)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int iVar4;
  allocator<char> local_29;
  string local_28;
  
  pcVar2 = internal::getContext(theWindowName);
  (pcVar2->mouse).anyButton.justReleased = false;
  (pcVar2->mouse).anyButton.justPressed = false;
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 3) {
    *(undefined2 *)(&(pcVar2->mouse).buttons[0].justReleased + lVar3) = 0;
  }
  internal::gScreen._128_4_ = 0;
  internal::gScreen._132_8_ = 0;
  internal::gScreen._112_8_ = 0;
  internal::gScreen._120_4_ = 0;
  internal::gScreen._124_4_ = 0;
  internal::gScreen._96_8_ = 0;
  internal::gScreen._104_8_ = 0;
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          internal::gInput,"");
  if (bVar1) {
    iVar4 = 0x28;
    if (0 < internal::gDelayWaitKey) {
      iVar4 = internal::gDelayWaitKey;
    }
    internal::gLastInputKeyPressed = cv::waitKeyEx(iVar4);
  }
  if (0 < internal::gDelayWaitKey) {
    internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
  }
  if (internal::gStackCount == -1) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update()."
             ,&local_29);
  internal::error(2,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void update(const cv::String& theWindowName) {
	cvui_context_t& aContext = internal::getContext(theWindowName);

	aContext.mouse.anyButton.justReleased = false;
	aContext.mouse.anyButton.justPressed = false;

	for (int i = cvui::LEFT_BUTTON; i <= cvui::RIGHT_BUTTON; i++) {
		aContext.mouse.buttons[i].justReleased = false;
		aContext.mouse.buttons[i].justPressed = false;
	}

	internal::resetRenderingBuffer(internal::gScreen);

    bool aAnyInputFocused = internal::gInput.name != "";

	if (aAnyInputFocused) {
		internal::gLastInputKeyPressed = cv::waitKeyEx(internal::gDelayWaitKey > 0 ? internal::gDelayWaitKey : 40);
	}

	// If we were told to keep track of the keyboard shortcuts, we
	// proceed to handle opencv event queue.
	if (internal::gDelayWaitKey > 0) {
		internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
	}

	if (!internal::blockStackEmpty()) {
		internal::error(2, "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update().");
	}
}